

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,ImWchar c)

{
  unsigned_short local_2;
  
  ImVector<unsigned_short>::push_back(&this->InputQueueCharacters,&local_2);
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(ImWchar c)
{
    InputQueueCharacters.push_back(c);
}